

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O0

file_storage * __thiscall libtorrent::create_torrent::files(create_torrent *this)

{
  bool bVar1;
  file_storage *pfVar2;
  int in_R8D;
  span<const_libtorrent::create_file_entry> files;
  anon_unknown_40 *local_d8;
  undefined8 local_d0;
  file_storage local_c8;
  create_torrent *local_10;
  create_torrent *this_local;
  
  local_10 = this;
  bVar1 = ::std::optional::operator_cast_to_bool((optional *)&this->m_file_storage_compat);
  if (!bVar1) {
    span<libtorrent::create_file_entry_const>::
    span<libtorrent::aux::container_wrapper<libtorrent::create_file_entry,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>>>,libtorrent::create_file_entry,void>
              ((span<libtorrent::create_file_entry_const> *)&local_d8,&this->m_files);
    files.m_len._0_4_ = this->m_piece_length;
    files.m_ptr = (create_file_entry *)local_d0;
    files.m_len._4_4_ = 0;
    anon_unknown_40::make_file_storage(&local_c8,local_d8,files,in_R8D);
    ::std::optional<libtorrent::file_storage>::operator=(&this->m_file_storage_compat,&local_c8);
    file_storage::~file_storage(&local_c8);
    pfVar2 = ::std::optional<libtorrent::file_storage>::operator->(&this->m_file_storage_compat);
    file_storage::set_num_pieces(pfVar2,this->m_num_pieces);
    pfVar2 = ::std::optional<libtorrent::file_storage>::operator->(&this->m_file_storage_compat);
    file_storage::set_piece_length(pfVar2,this->m_piece_length);
  }
  pfVar2 = ::std::optional<libtorrent::file_storage>::operator*(&this->m_file_storage_compat);
  return pfVar2;
}

Assistant:

file_storage const& create_torrent::files() const
	{
		if (!m_file_storage_compat)
		{
			m_file_storage_compat = make_file_storage(m_files, m_piece_length);
			m_file_storage_compat->set_num_pieces(m_num_pieces);
			m_file_storage_compat->set_piece_length(m_piece_length);
		}
		return *m_file_storage_compat;
	}